

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

int __thiscall Sudoku::smazat(Sudoku *this,int x,int y)

{
  int local_1ec;
  undefined1 local_1e8 [4];
  int i;
  Sudoku temp;
  int smazano;
  int v;
  int u;
  int y_local;
  int x_local;
  Sudoku *this_local;
  
  temp.s.doplnenych = 0;
  if ((((uint)(this->s).pole[y * 9 + x] & 0xf) == 0) ||
     ((*(byte *)((this->s).pole + (y * 9 + x)) >> 4 & 1) != 0)) {
    this_local._4_4_ = 0;
  }
  else {
    Sudoku((Sudoku *)local_1e8,-1);
    for (local_1ec = 0; local_1ec < 0x51; local_1ec = local_1ec + 1) {
      if ((local_1ec / 9 == y) && (local_1ec % 9 == x)) {
        temp.s.doplnenych = 1;
      }
      else if (((uint)(this->s).pole[local_1ec] & 0xf) != 0) {
        doplnM((Sudoku *)local_1e8,local_1ec % 9,local_1ec / 9,
               *(byte *)((this->s).pole + local_1ec) & 0xf);
        local_1e8[(long)local_1ec * 4] =
             local_1e8[(long)local_1ec * 4] & 0xef |
             (*(byte *)((this->s).pole + local_1ec) >> 4 & 1) << 4;
      }
    }
    memcpy(this,local_1e8,0x1bc);
    this_local._4_4_ = temp.s.doplnenych;
    ~Sudoku((Sudoku *)local_1e8);
  }
  return this_local._4_4_;
}

Assistant:

int Sudoku::smazat ( int x, int y )
{
  int u,v, smazano = false;
  if(!s.pole[y*9+x].zapsane || s.pole[y*9+x].pevne) // pokud na pozici nic neni nebo je tam pevne cislo, nic se nedeje
    return false;
  Sudoku temp (-1); // prazdne sudoku pro doplnovani
  // projdeme vse
  for (int i = 0;i < 81; i++)
  {
    // vynechavame pri kopirovani mazane policko
    if(i/9 == y && i%9 == x)
    {
      smazano = true;
      continue;
    }
    // nezapisujeme prazdna policka, doslo by k zaseknuti
    if (!s.pole[i].zapsane)
      continue;
    // doplnime zpet policko
    temp.doplnM (i%9, i/9, s.pole[i].zapsane);
    temp.s.pole[i].pevne = s.pole[i].pevne;
  }
  s = temp.s; // preneseni stavu do tohoto sudoku z docasneho
  return smazano;
}